

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O2

void __thiscall LogWriter::~LogWriter(LogWriter *this)

{
  ~LogWriter(this);
  operator_delete(this);
  return;
}

Assistant:

LogWriter(std::string fn) : vertices_(), logfile_(fn, std::ofstream::out), filename_(fn), iteration_(0) {}